

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void DoFilter6_C(uint8_t *p,int step)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int a3;
  int a2;
  int a1;
  int a;
  int q2;
  int q1;
  int q0;
  int p0;
  int p1;
  int p2;
  int step_local;
  uint8_t *p_local;
  
  bVar1 = p[step * -2];
  bVar2 = p[-step];
  bVar3 = *p;
  bVar4 = p[step];
  bVar5 = p[step << 1];
  iVar6 = (int)(char)sclip1[(long)(int)(((uint)bVar3 - (uint)bVar2) * 3 +
                                       (int)(char)sclip1[(long)(int)((uint)bVar1 - (uint)bVar4) +
                                                         0x3fc]) + 0x3fc];
  iVar7 = iVar6 * 0x1b + 0x3f >> 7;
  iVar8 = iVar6 * 0x12 + 0x3f >> 7;
  iVar6 = iVar6 * 9 + 0x3f >> 7;
  p[step * -3] = ""[(long)(int)((uint)p[step * -3] + iVar6) + 0xff];
  p[step * -2] = ""[(long)(int)((uint)bVar1 + iVar8) + 0xff];
  p[-step] = ""[(long)(int)((uint)bVar2 + iVar7) + 0xff];
  *p = ""[(long)(int)((uint)bVar3 - iVar7) + 0xff];
  p[step] = ""[(long)(int)((uint)bVar4 - iVar8) + 0xff];
  p[step << 1] = ""[(long)(int)((uint)bVar5 - iVar6) + 0xff];
  return;
}

Assistant:

static WEBP_INLINE void DoFilter6_C(uint8_t* p, int step) {
  const int p2 = p[-3*step], p1 = p[-2*step], p0 = p[-step];
  const int q0 = p[0], q1 = p[step], q2 = p[2*step];
  const int a = VP8ksclip1[3 * (q0 - p0) + VP8ksclip1[p1 - q1]];
  // a is in [-128,127], a1 in [-27,27], a2 in [-18,18] and a3 in [-9,9]
  const int a1 = (27 * a + 63) >> 7;  // eq. to ((3 * a + 7) * 9) >> 7
  const int a2 = (18 * a + 63) >> 7;  // eq. to ((2 * a + 7) * 9) >> 7
  const int a3 = (9  * a + 63) >> 7;  // eq. to ((1 * a + 7) * 9) >> 7
  p[-3*step] = VP8kclip1[p2 + a3];
  p[-2*step] = VP8kclip1[p1 + a2];
  p[-  step] = VP8kclip1[p0 + a1];
  p[      0] = VP8kclip1[q0 - a1];
  p[   step] = VP8kclip1[q1 - a2];
  p[ 2*step] = VP8kclip1[q2 - a3];
}